

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int setcasefold(int f,int n)

{
  int n_local;
  int f_local;
  
  if ((f & 7U) == 0) {
    casefoldsearch = 1;
    ewprintf("Case-fold-search set");
  }
  else {
    casefoldsearch = 0;
    ewprintf("Case-fold-search unset");
  }
  re_pat[0] = '\0';
  return 1;
}

Assistant:

int
setcasefold(int f, int n)
{
	if (f & FFARG) {
		casefoldsearch = FALSE;
		ewprintf("Case-fold-search unset");
	} else {
		casefoldsearch = TRUE;
		ewprintf("Case-fold-search set");
	}

	/*
	 * Invalidate the regular expression pattern since I'm too lazy to
	 * recompile it.
	 */
	re_pat[0] = '\0';
	return (TRUE);
}